

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O2

vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *
vk::getPhysicalDeviceQueueFamilyProperties
          (vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
           *__return_storage_ptr__,InstanceInterface *vk,VkPhysicalDevice physicalDevice)

{
  long lVar1;
  TestError *this;
  deUint32 numQueues;
  
  numQueues = 0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*vk->_vptr_InstanceInterface[6])(vk,physicalDevice,&numQueues,0);
  if ((ulong)numQueues != 0) {
    std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::resize
              (__return_storage_ptr__,(ulong)numQueues);
    (*vk->_vptr_InstanceInterface[6])
              (vk,physicalDevice,&numQueues,
               (__return_storage_ptr__->
               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               )._M_impl.super__Vector_impl_data._M_start);
    lVar1 = (long)(__return_storage_ptr__->
                  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    if (lVar1 / 0x18 != (ulong)numQueues) {
      this = (TestError *)__cxa_allocate_exception(0x38,0x18,lVar1 % 0x18);
      tcu::TestError::TestError
                (this,"Returned queue family count changes between queries",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0x40);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkQueueFamilyProperties> getPhysicalDeviceQueueFamilyProperties (const InstanceInterface& vk, VkPhysicalDevice physicalDevice)
{
	deUint32						numQueues	= 0;
	vector<VkQueueFamilyProperties>	properties;

	vk.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numQueues, DE_NULL);

	if (numQueues > 0)
	{
		properties.resize(numQueues);
		vk.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &numQueues, &properties[0]);

		if ((size_t)numQueues != properties.size())
			TCU_FAIL("Returned queue family count changes between queries");
	}

	return properties;
}